

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

void Fl::enable_im(void)

{
  Fl_X *xTemp;
  Fl_Window *pFVar1;
  
  pFVar1 = first_window();
  if ((pFVar1 != (Fl_Window *)0x0) && (pFVar1->i != (Fl_X *)0x0)) {
    fl_xim_activate(pFVar1->i->xid);
    XSetICFocus(fl_xim_ic);
    return;
  }
  fl_new_ic();
  return;
}

Assistant:

void Fl::enable_im() {
  Fl_Window *win;

  win = Fl::first_window();
  if (win && win->shown()) {
    fl_xim_activate(fl_xid(win));
    XSetICFocus(fl_xim_ic);
  } else {
    fl_new_ic();
  }
}